

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong mkvparser::Segment::CreateInstance
                   (IMkvReader *pReader,longlong pos,Segment **pSegment,Type type)

{
  bool bVar1;
  Type TVar2;
  Segment **ppSVar3;
  int iVar4;
  longlong lVar5;
  Segment **ppSVar6;
  Segment **ppSVar7;
  Segment *pSVar8;
  ulong uVar9;
  Segment **ppSVar10;
  Segment **pos_00;
  long len;
  longlong total;
  longlong available;
  long local_58;
  ulong local_50;
  ulong local_48;
  Type local_3c;
  Segment **local_38;
  
  ppSVar10 = (Segment **)0xffffffffffffffff;
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    *pSegment = (Segment *)0x0;
    iVar4 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_50,&local_48);
    if (iVar4 < 0) {
      ppSVar10 = (Segment **)(long)iVar4;
    }
    else {
      ppSVar10 = (Segment **)0xffffffffffffffff;
      if ((-1 < (long)local_48) && (local_3c = type, local_38 = pSegment, local_48 <= local_50)) {
        do {
          if ((-1 < (long)local_50) && ((long)local_50 <= pos)) {
            return -2;
          }
          ppSVar10 = (Segment **)GetUIntLength(pReader,pos,&local_58);
          if (ppSVar10 == (Segment **)0x0) {
            if ((-1 < (long)local_50) && ((long)local_50 < local_58 + pos)) {
              ppSVar10 = (Segment **)0xfffffffffffffffe;
              goto LAB_0010f770;
            }
            ppSVar10 = (Segment **)(local_58 + pos);
            if ((long)local_48 < (long)ppSVar10) goto LAB_0010f770;
            lVar5 = ReadID(pReader,pos,&local_58);
            ppSVar10 = (Segment **)0xfffffffffffffffe;
            if (lVar5 < 0) {
              bVar1 = false;
            }
            else {
              pos_00 = (Segment **)(local_58 + pos);
              ppSVar6 = (Segment **)GetUIntLength(pReader,(longlong)pos_00,&local_58);
              if ((ppSVar6 == (Segment **)0x0) &&
                 (((((long)local_50 < 0 ||
                    (ppSVar6 = ppSVar10, local_58 + (long)pos_00 <= (long)local_50)) &&
                   (ppSVar6 = (Segment **)(local_58 + (long)pos_00),
                   local_58 + (long)pos_00 <= (long)local_48)) &&
                  (ppSVar7 = (Segment **)ReadUInt(pReader,(longlong)pos_00,&local_58),
                  ppSVar3 = local_38, TVar2 = local_3c, ppSVar6 = ppSVar7, -1 < (long)ppSVar7)))) {
                pos_00 = (Segment **)((long)pos_00 + local_58);
                uVar9 = -1L << ((char)local_58 * '\a' & 0x3fU) ^ (ulong)ppSVar7;
                if (lVar5 == 0x18538067) {
                  ppSVar10 = (Segment **)0xffffffffffffffff;
                  if (((uVar9 != 0xffffffffffffffff) && (-1 < (long)local_50)) &&
                     (ppSVar10 = ppSVar7, (long)local_50 < (long)ppSVar7 + (long)pos_00)) {
                    ppSVar10 = (Segment **)0xffffffffffffffff;
                  }
                  pSVar8 = (Segment *)operator_new(0xd0,(nothrow_t *)&std::nothrow);
                  if (pSVar8 == (Segment *)0x0) {
                    pSVar8 = (Segment *)0x0;
                  }
                  else {
                    pSVar8->m_pReader = pReader;
                    pSVar8->m_element_start = pos;
                    pSVar8->m_start = (longlong)pos_00;
                    pSVar8->m_size = (longlong)ppSVar10;
                    (pSVar8->m_eos).m_pSegment = (Segment *)0x0;
                    (pSVar8->m_eos).m_element_start = 0;
                    (pSVar8->m_eos).m_index = 0;
                    (pSVar8->m_eos).m_pos = 0;
                    (pSVar8->m_eos).m_element_size = 0;
                    (pSVar8->m_eos).m_timecode = 0;
                    (pSVar8->m_eos).m_entries = (BlockEntry **)0x0;
                    (pSVar8->m_eos).m_entries_size = 0;
                    (pSVar8->m_eos).m_entries_count = 0;
                    pSVar8->m_type = TVar2;
                    pSVar8->m_pos = (longlong)pos_00;
                    pSVar8->m_pUnknownSize = (Cluster *)0x0;
                    pSVar8->m_pSeekHead = (SeekHead *)0x0;
                    pSVar8->m_pInfo = (SegmentInfo *)0x0;
                    pSVar8->m_pTracks = (Tracks *)0x0;
                    pSVar8->m_pCues = (Cues *)0x0;
                    pSVar8->m_pChapters = (Chapters *)0x0;
                    pSVar8->m_pTags = (Tags *)0x0;
                    pSVar8->m_clusters = (Cluster **)0x0;
                    pSVar8->m_clusterCount = 0;
                    pSVar8->m_clusterPreloadCount = 0;
                    pSVar8->m_clusterSize = 0;
                  }
                  *ppSVar3 = pSVar8;
                  bVar1 = false;
                  ppSVar10 = (Segment **)-(ulong)(pSVar8 == (Segment *)0x0);
                  pos = (longlong)pos_00;
                }
                else {
                  ppSVar6 = ppSVar10;
                  if (uVar9 == 0xffffffffffffffff) goto LAB_0010f7ed;
                  ppSVar7 = (Segment **)((long)ppSVar7 + (long)pos_00);
                  if (((long)local_50 < 0) || ((long)ppSVar7 <= (long)local_50)) {
                    pos = (longlong)pos_00;
                    if ((long)ppSVar7 <= (long)local_48) {
                      pos = (longlong)ppSVar7;
                    }
                    bVar1 = (long)ppSVar7 <= (long)local_48;
                    ppSVar10 = pSegment;
                    if ((long)local_48 < (long)ppSVar7) {
                      ppSVar10 = ppSVar7;
                    }
                  }
                  else {
                    bVar1 = false;
                    pos = (longlong)pos_00;
                  }
                }
              }
              else {
LAB_0010f7ed:
                bVar1 = false;
                ppSVar10 = ppSVar6;
                pos = (longlong)pos_00;
              }
            }
          }
          else {
LAB_0010f770:
            bVar1 = false;
          }
          pSegment = ppSVar10;
        } while (bVar1);
      }
    }
  }
  return (longlong)ppSVar10;
}

Assistant:

long long Segment::CreateInstance(IMkvReader* pReader, long long pos,
                                  Segment*& pSegment, Type type) {
  if (pReader == NULL || pos < 0)
    return E_PARSE_FAILED;

  pSegment = NULL;

  long long total, available;

  const long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (available < 0)
    return -1;

  if ((total >= 0) && (available > total))
    return -1;

  // I would assume that in practice this loop would execute
  // exactly once, but we allow for other elements (e.g. Void)
  // to immediately follow the EBML header.  This is fine for
  // the source filter case (since the entire file is available),
  // but in the splitter case over a network we should probably
  // just give up early.  We could for example decide only to
  // execute this loop a maximum of, say, 10 times.
  // TODO:
  // There is an implied "give up early" by only parsing up
  // to the available limit.  We do do that, but only if the
  // total file size is unknown.  We could decide to always
  // use what's available as our limit (irrespective of whether
  // we happen to know the total file length).  This would have
  // as its sense "parse this much of the file before giving up",
  // which a slightly different sense from "try to parse up to
  // 10 EMBL elements before giving up".

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return E_FILE_FORMAT_INVALID;

    // Read ID
    long len;
    long long result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return size;

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    // Handle "unknown size" for live streaming of webm files.
    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (id == libwebm::kMkvSegment) {
      if (size == unknown_size)
        size = -1;

      else if (total < 0)
        size = -1;

      else if ((pos + size) > total)
        size = -1;

      pSegment = new (std::nothrow) Segment(pReader, idpos, pos, size, type);
      if (pSegment == NULL)
        return E_PARSE_FAILED;

      return 0;  // success
    }

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + size) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + size) > available)
      return pos + size;

    pos += size;  // consume payload
  }
}